

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

int process_events_stone(CManager_conflict cm,int s,action_class c)

{
  FILE *pFVar1;
  char *pcVar2;
  FMFormat p_Var3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  queue_item *pqVar7;
  event_item *peVar8;
  int in_EDX;
  int in_ESI;
  CManager_conflict in_RDI;
  proto_action *p_3;
  event_item *last_event;
  timespec ts_7;
  timespec ts_6;
  proto_action *p_2;
  int in_play;
  int out_count;
  int *out_stones;
  void *client_data_1;
  EVImmediateHandlerFunc func;
  proto_action *p_1;
  int t;
  timespec ts_5;
  timespec ts_4;
  timespec ts_3;
  queue_item *last;
  queue_item *tmp_2;
  queue_item *tmp_1;
  EVRawHandlerFunc han;
  queue_item *new;
  timespec ts_2;
  void *client_data;
  EVSimpleHandlerFunc handler;
  terminal_proto_vals *term;
  int out;
  proto_action *p;
  int proto;
  ev_handler_activation_rec act_rec;
  event_item *event_1;
  timespec ts_1;
  timespec ts;
  event_item *old_data_event;
  event_item *event_to_submit;
  char *tmp;
  event_item *event;
  int resp_id;
  response_cache_element *act;
  response_cache_element *resp;
  queue_item *next;
  action_state as;
  queue_item *item;
  int did_something;
  int more_pending;
  stone_type stone;
  event_path_data evp;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  CManager_conflict in_stack_fffffffffffffd88;
  CManager_conflict in_stack_fffffffffffffd90;
  FILE *in_stack_fffffffffffffd98;
  CManager in_stack_fffffffffffffda0;
  FILE *in_stack_fffffffffffffda8;
  CManager_conflict in_stack_fffffffffffffdb0;
  CManager_conflict in_stack_fffffffffffffdb8;
  CMTraceType trace_type;
  CManager in_stack_fffffffffffffdc0;
  FILE *in_stack_fffffffffffffdc8;
  FILE *in_stack_fffffffffffffdd0;
  CManager_conflict in_stack_fffffffffffffdd8;
  event_item *in_stack_fffffffffffffde0;
  ulong in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  CManager_conflict in_stack_fffffffffffffdf8;
  response_cache_element *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 uVar9;
  CManager_conflict in_stack_fffffffffffffe38;
  timespec local_1b8;
  timespec local_1a8;
  _proto_action *local_198;
  int local_190;
  int local_18c;
  int *local_188;
  FMFormat local_180;
  EVImmediateHandlerFunc local_178;
  _proto_action *local_170;
  int local_164;
  timespec local_160;
  timespec local_150;
  undefined4 local_140;
  int in_stack_fffffffffffffec4;
  CManager_conflict in_stack_fffffffffffffec8;
  queue_item *local_130;
  queue_item *local_128;
  timespec local_108;
  attr_list local_f8;
  EVSimpleHandlerFunc local_f0;
  anon_union_48_6_c1ce387a_for_o *local_e8;
  int local_dc;
  _proto_action *local_d8;
  int local_cc;
  int local_b8;
  event_item *local_a8;
  timespec local_a0;
  timespec local_90;
  event_item *local_80;
  event_item *local_78;
  void *local_70;
  event_item *local_68;
  uint local_5c;
  response_cache_element *local_58;
  response_cache_element *local_50;
  queue_item *local_48;
  int *local_40;
  queue_item *local_38;
  int local_30;
  int local_2c;
  stone_type local_28;
  _event_path_data *local_20;
  int local_18;
  CManager_conflict local_10;
  
  local_20 = in_RDI->evp;
  local_28 = (stone_type)0x0;
  local_2c = 0;
  local_30 = 0;
  local_40 = (int *)local_20->as;
  if (in_ESI != -1) {
    if (*local_40 == in_ESI) {
      *local_40 = -1;
    }
    local_18 = in_EDX;
    local_10 = in_RDI;
    local_28 = stone_struct((event_path_data)
                            CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),0);
    if ((local_28 != (stone_type)0x0) && (local_28->queue_size != 0)) {
      iVar4 = CMtrace_val[10];
      if (local_10->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,
                             (CMTraceType)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      }
      if (iVar4 != 0) {
        fprintf((FILE *)local_10->CMTrace_file,"Considering events on ");
        fprint_stone_identifier
                  ((FILE *)in_stack_fffffffffffffd90,(event_path_data)in_stack_fffffffffffffd88,
                   in_stack_fffffffffffffd84);
        fprintf((FILE *)local_10->CMTrace_file,"\n");
      }
      if (((local_28->local_id != -1) && (local_28->is_draining != 2)) && (local_28->is_frozen != 1)
         ) {
        if ((local_18 == 1) && (local_28->pending_output != 0)) {
          iVar4 = process_stone_pending_output
                            (in_stack_fffffffffffffdc0,
                             (EVstone)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
          local_2c = iVar4 + local_2c;
        }
        iVar4 = is_bridge_stone(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
        if (((iVar4 == 0) || (local_18 == 2)) || (local_18 == 3)) {
          iVar4 = CMtrace_val[10];
          if (local_10->CMTrace_file == (FILE *)0x0) {
            iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,
                                 (CMTraceType)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
          }
          if (iVar4 != 0) {
            fprintf((FILE *)local_10->CMTrace_file,"Process events ");
            fprint_stone_identifier
                      ((FILE *)in_stack_fffffffffffffd90,(event_path_data)in_stack_fffffffffffffd88,
                       in_stack_fffffffffffffd84);
            fprintf((FILE *)local_10->CMTrace_file,"\n");
          }
          local_38 = local_28->queue->queue_head;
          iVar4 = is_bridge_stone(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
          pqVar7 = local_38;
          if ((iVar4 == 0) || (local_18 != 2)) {
LAB_001456d9:
            do {
              local_38 = pqVar7;
              uVar9 = false;
              if ((local_38 != (queue_item *)0x0) && (uVar9 = false, local_28->is_draining == 0)) {
                uVar9 = local_28->is_frozen == 0;
              }
              if ((bool)uVar9 == false) goto LAB_00146e82;
              local_48 = local_38->next;
              local_58 = (response_cache_element *)0x0;
              pqVar7 = local_48;
            } while (local_38->handled != 0);
            local_68 = local_38->item;
            local_5c = determine_action(in_stack_fffffffffffffdf8,
                                        (stone_type)in_stack_fffffffffffffdf0,
                                        (action_class)(in_stack_fffffffffffffde8 >> 0x20),
                                        in_stack_fffffffffffffde0,
                                        (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
            if (local_28->response_cache_count <= (int)local_5c) {
              __assert_fail("resp_id < stone->response_cache_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                            ,0x6d0,"int process_events_stone(CManager, int, action_class)");
            }
            if ((local_28->response_cache[(int)local_5c].action_type == Action_NoAction) &&
               (local_18 == 1)) {
              local_70 = (void *)0x0;
              if (local_68->reference_format != (FMFormat)0x0) {
                local_70 = (void *)global_name_of_FMFormat(local_68->reference_format);
              }
              printf("No action found for event %p submitted to \n",local_68);
              print_stone_identifier
                        ((event_path_data)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         in_stack_fffffffffffffd7c);
              printf("\n");
              stone_struct((event_path_data)
                           CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),0);
              dump_stone((stone_type)0x1458a1);
              if (local_70 == (void *)0x0) {
                printf("    Unhandled incoming event format was NULL\n");
              }
              else {
                printf("    Unhandled incoming event format was \"%s\"\n",local_70);
                if (process_events_stone::first != 0) {
                  process_events_stone::first = 0;
                  printf(
                        "\n\t** use \"format_info <format_name>\" to get full format information ** \n\n"
                        );
                }
              }
              if (local_70 != (void *)0x0) {
                free(local_70);
              }
              local_68 = dequeue_item(in_stack_fffffffffffffdb8,
                                      (stone_type)in_stack_fffffffffffffdb0,
                                      (queue_item *)in_stack_fffffffffffffda8);
              return_event((event_path_data)in_stack_fffffffffffffdc0,
                           (event_item *)in_stack_fffffffffffffdb8);
            }
            local_50 = local_28->response_cache + (int)local_5c;
            if (local_50->action_type == Action_Decode) {
              if (local_68->event_encoded == 0) {
                iVar4 = CMtrace_val[10];
                if (local_10->CMTrace_file == (FILE *)0x0) {
                  iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,
                                       (CMTraceType)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
                }
                if (iVar4 != 0) {
                  if (CMtrace_PID != 0) {
                    pFVar1 = (FILE *)local_10->CMTrace_file;
                    _Var5 = getpid();
                    in_stack_fffffffffffffe28 = (response_cache_element *)(long)_Var5;
                    pVar6 = pthread_self();
                    fprintf(pFVar1,"P%lxT%lx - ",in_stack_fffffffffffffe28,pVar6);
                  }
                  if (CMtrace_timing != 0) {
                    clock_gettime(1,&local_90);
                    fprintf((FILE *)local_10->CMTrace_file,"%lld.%.9ld - ",local_90.tv_sec,
                            local_90.tv_nsec);
                  }
                  fprintf((FILE *)local_10->CMTrace_file,
                          "Encoding event prior to decode for conversion, action id %d\n",
                          (ulong)local_5c);
                }
                fflush((FILE *)local_10->CMTrace_file);
                local_80 = reassign_memory_event
                                     (in_stack_fffffffffffffdd8,
                                      (event_item *)in_stack_fffffffffffffdd0,
                                      (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
                return_event((event_path_data)in_stack_fffffffffffffdc0,
                             (event_item *)in_stack_fffffffffffffdb8);
                local_68->ref_count = local_68->ref_count + 1;
              }
              iVar4 = CMtrace_val[10];
              if (local_10->CMTrace_file == (FILE *)0x0) {
                iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,
                                     (CMTraceType)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
              }
              if (iVar4 != 0) {
                if (CMtrace_PID != 0) {
                  pFVar1 = (FILE *)local_10->CMTrace_file;
                  _Var5 = getpid();
                  pVar6 = pthread_self();
                  fprintf(pFVar1,"P%lxT%lx - ",(long)_Var5,pVar6);
                }
                if (CMtrace_timing != 0) {
                  clock_gettime(1,&local_a0);
                  fprintf((FILE *)local_10->CMTrace_file,"%lld.%.9ld - ",local_a0.tv_sec,
                          local_a0.tv_nsec);
                }
                fprintf((FILE *)local_10->CMTrace_file,"Decoding event, action id %d\n",
                        (ulong)local_5c);
              }
              fflush((FILE *)local_10->CMTrace_file);
              local_78 = decode_action(in_stack_fffffffffffffe38,
                                       (event_item *)CONCAT17(uVar9,in_stack_fffffffffffffe30),
                                       in_stack_fffffffffffffe28);
              if (local_78 == (event_item *)0x0) {
                return local_2c;
              }
              local_38->item = local_78;
              local_5c = determine_action(in_stack_fffffffffffffdf8,
                                          (stone_type)in_stack_fffffffffffffdf0,
                                          (action_class)(in_stack_fffffffffffffde8 >> 0x20),
                                          in_stack_fffffffffffffde0,
                                          (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
              local_50 = local_28->response_cache + (int)local_5c;
            }
            iVar4 = CMtrace_val[10];
            if (local_10->CMTrace_file == (FILE *)0x0) {
              iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,
                                   (CMTraceType)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
            }
            if (iVar4 != 0) {
              fprintf((FILE *)local_10->CMTrace_file,"next action event %p on ",local_68);
              fprint_stone_identifier
                        ((FILE *)in_stack_fffffffffffffd90,
                         (event_path_data)in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
              in_stack_fffffffffffffdf8 = (CManager_conflict)local_10->CMTrace_file;
              pcVar2 = action_str[local_50->action_type];
              p_Var3 = local_50->reference_format;
              if (local_50->reference_format == (FMFormat)0x0) {
                in_stack_fffffffffffffdf0 = "<none>";
              }
              else {
                in_stack_fffffffffffffdf0 =
                     (char *)global_name_of_FMFormat(local_50->reference_format);
              }
              in_stack_fffffffffffffd78 = local_50->requires_decoded;
              fprintf((FILE *)in_stack_fffffffffffffdf8,
                      " action type is %s, reference_format is %p (%s), stage is %d, requires_decoded is %d\n"
                      ,pcVar2,p_Var3,in_stack_fffffffffffffdf0,(ulong)local_50->stage);
              fdump_action(in_stack_fffffffffffffdd0,(stone_type)in_stack_fffffffffffffdc8,
                           (response_cache_element *)in_stack_fffffffffffffdc0,
                           (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                           (char *)in_stack_fffffffffffffdb0);
            }
            local_58 = local_28->response_cache + (int)local_5c;
            backpressure_check(in_stack_fffffffffffffdb0,
                               (EVstone)((ulong)in_stack_fffffffffffffda8 >> 0x20));
            iVar4 = compatible_stages(local_18,local_58->stage);
            if (iVar4 != 0) {
              iVar4 = is_immediate_action(local_58);
              if (iVar4 == 0) {
                iVar4 = is_multi_action(local_58);
                if ((iVar4 != 0) || (iVar4 = is_congestion_action(local_58), iVar4 != 0)) {
                  if ((local_28->new_enqueue_flag != 0) && (local_38->handled == 0)) {
                    local_30 = 1;
                    local_28->is_processing = 1;
                    local_38->handled = 1;
                    iVar4 = (*(local_58->o).imm.handler)
                                      (local_10,(_event_item *)local_28->queue,local_38,
                                       (attr_list)(local_58->o).decode.target_reference_format,
                                       local_28->output_count,local_28->output_stone_ids);
                    if (iVar4 != 0) {
                      local_2c = local_2c + 1;
                    }
                    local_28 = stone_struct((event_path_data)
                                            CONCAT44(in_stack_fffffffffffffd7c,
                                                     in_stack_fffffffffffffd78),0);
                    local_28->is_processing = 0;
                  }
LAB_00146e82:
                  if (local_30 != 0) {
                    local_28->new_enqueue_flag = 0;
                  }
                  return local_2c;
                }
              }
              else {
                local_a8 = dequeue_item(in_stack_fffffffffffffdb8,
                                        (stone_type)in_stack_fffffffffffffdb0,
                                        (queue_item *)in_stack_fffffffffffffda8);
                in_stack_fffffffffffffde8 = (ulong)(local_58->action_type - Action_Bridge);
                switch(in_stack_fffffffffffffde8) {
                case 0:
                default:
                  __assert_fail("FALSE",
                                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                ,0x796,"int process_events_stone(CManager, int, action_class)");
                case 1:
                  in_stack_fffffffffffffe38 =
                       (CManager_conflict)(local_28->proto_actions + local_58->proto_action_id);
                  pqVar7 = local_38;
                  if (in_stack_fffffffffffffe38->in_format_count != 0) goto LAB_001456d9;
                  thread_bridge_transfer
                            (in_stack_fffffffffffffdb0,(event_item *)in_stack_fffffffffffffda8,
                             in_stack_fffffffffffffda0,
                             (EVstone)((ulong)in_stack_fffffffffffffd98 >> 0x20));
                  break;
                case 2:
                case 3:
                  local_cc = local_58->proto_action_id;
                  local_d8 = local_28->proto_actions + local_cc;
                  local_e8 = &local_d8->o;
                  local_f0 = (local_e8->term).handler;
                  local_f8 = (attr_list)(local_d8->o).term.client_data;
                  iVar4 = CMtrace_val[10];
                  if (local_10->CMTrace_file == (FILE *)0x0) {
                    iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,
                                         (CMTraceType)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
                  }
                  if (iVar4 != 0) {
                    if (CMtrace_PID != 0) {
                      in_stack_fffffffffffffdd8 = (CManager_conflict)local_10->CMTrace_file;
                      _Var5 = getpid();
                      in_stack_fffffffffffffde0 = (event_item *)(long)_Var5;
                      pVar6 = pthread_self();
                      fprintf((FILE *)in_stack_fffffffffffffdd8,"P%lxT%lx - ",
                              in_stack_fffffffffffffde0,pVar6);
                    }
                    if (CMtrace_timing != 0) {
                      clock_gettime(1,&local_108);
                      fprintf((FILE *)local_10->CMTrace_file,"%lld.%.9ld - ",local_108.tv_sec,
                              local_108.tv_nsec);
                    }
                    fprintf((FILE *)local_10->CMTrace_file,"Executing terminal/filter event\n");
                  }
                  fflush((FILE *)local_10->CMTrace_file);
                  update_event_length_sum
                            (in_stack_fffffffffffffd90,(proto_action *)in_stack_fffffffffffffd88,
                             (event_item *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
                  pqVar7 = (queue_item *)
                           INT_CMmalloc(CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80
                                                ));
                  pqVar7->item = local_a8;
                  pqVar7->next = local_10->evp->current_event_list;
                  local_10->evp->current_event_list = pqVar7;
                  local_30 = 1;
                  local_28->is_processing = 1;
                  if ((local_d8->data_state == Requires_Contig_Encoded) &&
                     (local_a8->event_encoded == 0)) {
                    encode_event((CManager_conflict)
                                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                                 (event_item *)
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
                  }
                  local_b8 = local_28->local_id;
                  push_activation_record_on_stack
                            ((CManager_conflict)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                             (ev_handler_activation_ptr)
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
                  IntCManager_unlock(in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,
                                     (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
                  if (local_a8->event_encoded == 0) {
                    local_dc = (*local_f0)(local_10,local_a8->decoded_event,local_f8,local_a8->attrs
                                          );
                  }
                  else {
                    local_dc = (*(local_e8->term).handler)
                                         (local_10,local_a8->encoded_event,
                                          (void *)local_a8->event_len,local_f8);
                  }
                  IntCManager_lock(in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,
                                   (int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
                  local_28 = stone_struct((event_path_data)
                                          CONCAT44(in_stack_fffffffffffffd7c,
                                                   in_stack_fffffffffffffd78),0);
                  pop_activation_record_from_stack
                            (in_stack_fffffffffffffd90,
                             (ev_handler_activation_ptr)in_stack_fffffffffffffd88);
                  local_28->is_processing = 0;
                  if (local_10->evp->current_event_list->item == local_a8) {
                    pqVar7 = local_10->evp->current_event_list;
                    local_10->evp->current_event_list = pqVar7->next;
                    free(pqVar7);
                  }
                  else {
                    local_128 = local_10->evp->current_event_list;
                    do {
                      if (local_128->item == local_a8) break;
                      local_130 = local_128;
                      local_128 = local_128->next;
                    } while (local_128 != (queue_item *)0x0);
                    if (local_128 == (queue_item *)0x0) {
                      printf("Failed to dequeue item from executing events list!\n");
                    }
                    else {
                      local_130->next = local_128->next;
                      free(local_128);
                    }
                  }
                  trace_type = (CMTraceType)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
                  if (local_58->action_type == Action_Filter) {
                    if (local_dc == 0) {
                      iVar4 = CMtrace_val[10];
                      if (local_10->CMTrace_file == (FILE *)0x0) {
                        iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,trace_type);
                      }
                      if (iVar4 != 0) {
                        if (CMtrace_PID != 0) {
                          in_stack_fffffffffffffdb8 = (CManager_conflict)local_10->CMTrace_file;
                          _Var5 = getpid();
                          in_stack_fffffffffffffdc0 = (CManager)(long)_Var5;
                          pVar6 = pthread_self();
                          fprintf((FILE *)in_stack_fffffffffffffdb8,"P%lxT%lx - ",
                                  in_stack_fffffffffffffdc0,pVar6);
                        }
                        if (CMtrace_timing != 0) {
                          clock_gettime(1,&local_150);
                          fprintf((FILE *)local_10->CMTrace_file,"%lld.%.9ld - ",local_150.tv_sec,
                                  local_150.tv_nsec);
                        }
                        fprintf((FILE *)local_10->CMTrace_file,"Filter discarded event\n");
                      }
                      fflush((FILE *)local_10->CMTrace_file);
                    }
                    else {
                      iVar4 = CMtrace_val[10];
                      if (local_10->CMTrace_file == (FILE *)0x0) {
                        iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,trace_type);
                      }
                      if (iVar4 != 0) {
                        if (CMtrace_PID != 0) {
                          in_stack_fffffffffffffdc8 = (FILE *)local_10->CMTrace_file;
                          _Var5 = getpid();
                          in_stack_fffffffffffffdd0 = (FILE *)(long)_Var5;
                          pVar6 = pthread_self();
                          fprintf(in_stack_fffffffffffffdc8,"P%lxT%lx - ",in_stack_fffffffffffffdd0,
                                  pVar6);
                        }
                        if (CMtrace_timing != 0) {
                          clock_gettime(1,(timespec *)&local_140);
                          fprintf((FILE *)local_10->CMTrace_file,"%lld.%.9ld - ",
                                  CONCAT44(in_stack_fffffffffffffec4,local_140),
                                  in_stack_fffffffffffffec8);
                        }
                        fprintf((FILE *)local_10->CMTrace_file,
                                "Filter passed event to stone %x, submitting\n",
                                (ulong)(uint)(local_e8->term).target_stone_id);
                      }
                      fflush((FILE *)local_10->CMTrace_file);
                      internal_path_submit
                                (in_stack_fffffffffffffd90,
                                 (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                                 (event_item *)
                                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
                      local_2c = local_2c + 1;
                    }
                  }
                  else {
                    iVar4 = CMtrace_val[10];
                    if (local_10->CMTrace_file == (FILE *)0x0) {
                      iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,trace_type);
                    }
                    if (iVar4 != 0) {
                      if (CMtrace_PID != 0) {
                        in_stack_fffffffffffffda8 = (FILE *)local_10->CMTrace_file;
                        _Var5 = getpid();
                        in_stack_fffffffffffffdb0 = (CManager_conflict)(long)_Var5;
                        pVar6 = pthread_self();
                        fprintf(in_stack_fffffffffffffda8,"P%lxT%lx - ",in_stack_fffffffffffffdb0,
                                pVar6);
                      }
                      if (CMtrace_timing != 0) {
                        clock_gettime(1,&local_160);
                        fprintf((FILE *)local_10->CMTrace_file,"%lld.%.9ld - ",local_160.tv_sec,
                                local_160.tv_nsec);
                      }
                      fprintf((FILE *)local_10->CMTrace_file,"Finish terminal event\n");
                    }
                    fflush((FILE *)local_10->CMTrace_file);
                  }
                  return_event((event_path_data)in_stack_fffffffffffffdc0,
                               (event_item *)in_stack_fffffffffffffdb8);
                  break;
                case 4:
                  local_190 = local_40[1];
                  local_178 = (local_58->o).imm.handler;
                  local_180 = (local_58->o).decode.target_reference_format;
                  local_188 = local_28->output_stone_ids;
                  local_18c = local_28->output_count;
                  local_30 = 1;
                  local_28->is_processing = 1;
                  (*local_178)(local_10,local_a8,local_180,local_a8->attrs,local_18c,local_188);
                  local_28 = stone_struct((event_path_data)
                                          CONCAT44(in_stack_fffffffffffffd7c,
                                                   in_stack_fffffffffffffd78),0);
                  local_28->is_processing = 0;
                  return_event((event_path_data)in_stack_fffffffffffffdc0,
                               (event_item *)in_stack_fffffffffffffdb8);
                  if (local_190 < local_40[1]) {
                    local_2c = local_2c + 1;
                  }
                  break;
                case 8:
                  local_164 = 0;
                  local_170 = local_28->proto_actions + local_58->proto_action_id;
                  update_event_length_sum
                            (in_stack_fffffffffffffd90,(proto_action *)in_stack_fffffffffffffd88,
                             (event_item *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
                  for (local_164 = 0; local_164 < local_28->output_count; local_164 = local_164 + 1)
                  {
                    if (local_28->output_stone_ids[local_164] != -1) {
                      internal_path_submit
                                (in_stack_fffffffffffffd90,
                                 (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                                 (event_item *)
                                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
                      local_2c = local_2c + 1;
                    }
                  }
                  return_event((event_path_data)in_stack_fffffffffffffdc0,
                               (event_item *)in_stack_fffffffffffffdb8);
                  break;
                case 9:
                  local_198 = local_28->proto_actions + local_58->proto_action_id;
                  storage_queue_enqueue
                            ((CManager_conflict)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                             (storage_queue_ptr)
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                             (event_item *)0x1469c3);
                  iVar4 = CMtrace_val[10];
                  if (local_10->CMTrace_file == (FILE *)0x0) {
                    iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,
                                         (CMTraceType)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
                  }
                  if (iVar4 != 0) {
                    if (CMtrace_PID != 0) {
                      in_stack_fffffffffffffd98 = (FILE *)local_10->CMTrace_file;
                      _Var5 = getpid();
                      in_stack_fffffffffffffda0 = (CManager)(long)_Var5;
                      pVar6 = pthread_self();
                      fprintf(in_stack_fffffffffffffd98,"P%lxT%lx - ",in_stack_fffffffffffffda0,
                              pVar6);
                    }
                    if (CMtrace_timing != 0) {
                      clock_gettime(1,&local_1a8);
                      fprintf((FILE *)local_10->CMTrace_file,"%lld.%.9ld - ",local_1a8.tv_sec,
                              local_1a8.tv_nsec);
                    }
                    fprintf((FILE *)local_10->CMTrace_file,"Enqueued item to store\n");
                  }
                  fflush((FILE *)local_10->CMTrace_file);
                  iVar4 = (local_198->o).term.target_stone_id + 1;
                  (local_198->o).term.target_stone_id = iVar4;
                  if (((local_198->o).store.max_stored < iVar4) &&
                     ((local_198->o).store.max_stored != -1)) {
                    iVar4 = CMtrace_val[10];
                    if (local_10->CMTrace_file == (FILE *)0x0) {
                      iVar4 = CMtrace_init(in_stack_fffffffffffffdc0,
                                           (CMTraceType)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
                    }
                    if (iVar4 != 0) {
                      if (CMtrace_PID != 0) {
                        in_stack_fffffffffffffd88 = (CManager_conflict)local_10->CMTrace_file;
                        _Var5 = getpid();
                        in_stack_fffffffffffffd90 = (CManager_conflict)(long)_Var5;
                        pVar6 = pthread_self();
                        fprintf((FILE *)in_stack_fffffffffffffd88,"P%lxT%lx - ",
                                in_stack_fffffffffffffd90,pVar6);
                      }
                      if (CMtrace_timing != 0) {
                        clock_gettime(1,&local_1b8);
                        fprintf((FILE *)local_10->CMTrace_file,"%lld.%.9ld - ",local_1b8.tv_sec,
                                local_1b8.tv_nsec);
                      }
                      fprintf((FILE *)local_10->CMTrace_file,"Dequeuing item because of limit\n");
                    }
                    fflush((FILE *)local_10->CMTrace_file);
                    peVar8 = storage_queue_dequeue
                                       ((CManager_conflict)
                                        CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80
                                                ),
                                        (storage_queue_ptr)
                                        CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78
                                                ));
                    if (peVar8->ref_count < 1) {
                      __assert_fail("last_event->ref_count > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                    ,0x785,"int process_events_stone(CManager, int, action_class)");
                    }
                    (local_198->o).term.target_stone_id = (local_198->o).term.target_stone_id + -1;
                    internal_path_submit
                              (in_stack_fffffffffffffd90,
                               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                               (event_item *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
                    return_event((event_path_data)in_stack_fffffffffffffdc0,
                                 (event_item *)in_stack_fffffffffffffdb8);
                    local_2c = local_2c + 1;
                  }
                }
              }
            }
            local_38 = local_48;
            pqVar7 = local_38;
            goto LAB_001456d9;
          }
          local_28->is_processing = 1;
          do_bridge_action(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
          local_28->is_processing = 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int
process_events_stone(CManager cm, int s, action_class c)
{

/*  Process all possible events on this stone that match the class */

    event_path_data evp = cm->evp;
    stone_type stone = NULL;
    int more_pending = 0;
    int did_something = 0;
    queue_item *item;
    action_state as = evp->as;


    if (s == -1) return 0;
    if (as->last_active_stone == s) as->last_active_stone = -1;
    stone = stone_struct(cm->evp, s);
    if (!stone) return 0;
    if (stone->queue_size == 0) return 0;
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Considering events on ");
	fprint_stone_identifier(cm->CMTrace_file, evp, s);
	fprintf(cm->CMTrace_file, "\n");
    }
    if (stone->local_id == -1) return 0;
    if (stone->is_draining == 2) return 0;
    if (stone->is_frozen == 1) return 0;
    if (c == Immediate_and_Multi && stone->pending_output) {
        more_pending += process_stone_pending_output(cm, s);
    }
    if (is_bridge_stone(cm, s) && (c != Bridge) && (c != Congestion)) return 0;
    
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Process events ");
	fprint_stone_identifier(cm->CMTrace_file, evp, s);
	fprintf(cm->CMTrace_file, "\n");
    }
    item = stone->queue->queue_head;
    if (is_bridge_stone(cm, s) && (c == Bridge)) {
	stone->is_processing = 1;
	do_bridge_action(cm, s);
	stone->is_processing = 0;
	return 0;
    }
    while (item != NULL && stone->is_draining == 0 && stone->is_frozen == 0) {
	queue_item *next = item->next;
	response_cache_element *resp;
	response_cache_element *act = NULL;
	if (item->handled) {
	    item = next;
	    continue;
	} else {
	    /* determine what kind of action to take here */
	    int resp_id;
	    event_item *event = item->item;
	    resp_id = determine_action(cm, stone, c, item->item, 0);
            assert(resp_id < stone->response_cache_count);
	    if (stone->response_cache[resp_id].action_type == Action_NoAction
                && c == Immediate_and_Multi) {
                /* ignore event */
                char *tmp = NULL;
                if (event->reference_format)
                    tmp = global_name_of_FMFormat(event->reference_format);
                printf("No action found for event %p submitted to \n", event);
		print_stone_identifier(evp, s);
		printf("\n");
                dump_stone(stone_struct(evp, s));
                if (tmp != NULL) {
                    static int first = 1;
                    printf("    Unhandled incoming event format was \"%s\"\n", tmp);
                    if (first) {
                        first = 0;
                        printf("\n\t** use \"format_info <format_name>\" to get full format information ** \n\n");
                    }
                } else {
                    printf("    Unhandled incoming event format was NULL\n");
                }
                if (tmp) free(tmp);
                event = dequeue_item(cm, stone, item);
                return_event(evp, event);
            }
	    resp = &stone->response_cache[resp_id];
	    if (resp->action_type == Action_Decode) {
		event_item *event_to_submit;
		if (!event->event_encoded) {
		    event_item *old_data_event;
		    CMtrace_out(cm, EVerbose, "Encoding event prior to decode for conversion, action id %d\n", resp_id);
		    old_data_event = reassign_memory_event(cm, event, 0);  /* reassign memory */
		    return_event(evp, old_data_event);
		    event->ref_count++;
		}
		CMtrace_out(cm, EVerbose, "Decoding event, action id %d\n", resp_id);
		event_to_submit = decode_action(cm, event, resp);
		if (event_to_submit == NULL) return more_pending;
		item->item = event_to_submit;
		resp_id = determine_action(cm, stone, c, event_to_submit, 0);
		resp = &stone->response_cache[resp_id];
	    }
	    if (CMtrace_on(cm, EVerbose)) {
		fprintf(cm->CMTrace_file, "next action event %p on ", event);
		fprint_stone_identifier(cm->CMTrace_file, evp, s);
		fprintf(cm->CMTrace_file, " action type is %s, reference_format is %p (%s), stage is %d, requires_decoded is %d\n",
			action_str[resp->action_type], resp->reference_format, 
			resp->reference_format ? global_name_of_FMFormat(resp->reference_format) : "<none>",
			resp->stage, resp->requires_decoded);
		fdump_action(cm->CMTrace_file, stone, resp, resp->proto_action_id, "    ");
	    }
            act = &stone->response_cache[resp_id];
	}
        backpressure_check(cm, s);
        if (!compatible_stages(c, act->stage)) {
	    /* do nothing */
        } else if (is_immediate_action(act)) {
	    event_item *event = dequeue_item(cm, stone, item);
	    ev_handler_activation_rec act_rec;
	    switch(act->action_type) {
	    case Action_Terminal:
	    case Action_Filter: {
		/* the data should already be in the right format */
		int proto = act->proto_action_id;
		proto_action *p = &stone->proto_actions[proto];
		int out;
		struct terminal_proto_vals *term = &(p->o.term);
		EVSimpleHandlerFunc handler = term->handler;
		void *client_data = term->client_data;
		CMtrace_out(cm, EVerbose, "Executing terminal/filter event\n");
		update_event_length_sum(cm, p, event);
		{
		    queue_item *new = malloc(sizeof(queue_item));
		    new->item = event;
		    new->next = cm->evp->current_event_list;
		    cm->evp->current_event_list = new;
		}
		did_something=1;
		stone->is_processing = 1;
		if ((p->data_state == Requires_Contig_Encoded) && 
		    (event->event_encoded == 0)) {
		    encode_event(cm, event);
		}
		act_rec.stone_id = stone->local_id;
		push_activation_record_on_stack(cm, &act_rec);
		CManager_unlock(cm);
		if (event->event_encoded == 0) {
		    out = (handler)(cm, event->decoded_event, client_data,
				    event->attrs);
		} else {
		    EVRawHandlerFunc han = (EVRawHandlerFunc)term->handler;
		    out = (han)(cm, event->encoded_event, event->event_len,
				    client_data, event->attrs);
		}
		CManager_lock(cm);
		stone = stone_struct(cm->evp, s);
		pop_activation_record_from_stack(cm, &act_rec);
		stone->is_processing = 0;
		{
		    if (cm->evp->current_event_list->item == event) {
			queue_item *tmp = cm->evp->current_event_list;
			cm->evp->current_event_list = tmp->next;
			free(tmp);
		    } else {
			queue_item *tmp = cm->evp->current_event_list;
			queue_item *last;
			while(tmp->item != event) {
			    last = tmp;
			    tmp = tmp->next;
			    if (tmp == NULL) break;
			}
			if (tmp == NULL) {
			    printf("Failed to dequeue item from executing events list!\n");
			} else {
			    last->next = tmp->next;
			    free(tmp);
			}
		    }
		}

		if (act->action_type == Action_Filter) {
		    if (out) {
			CMtrace_out(cm, EVerbose, "Filter passed event to stone %x, submitting\n", term->target_stone_id);
			internal_path_submit(cm, 
					     term->target_stone_id,
					     event);
			more_pending++;
		    } else {
			CMtrace_out(cm, EVerbose, "Filter discarded event\n");
		    }			    
		} else {
		    CMtrace_out(cm, EVerbose, "Finish terminal event\n");
		}
		return_event(evp, event);
		break;
	    }
	    case Action_Split: {
		int t = 0;
		proto_action *p = &stone->proto_actions[act->proto_action_id];
		update_event_length_sum(cm, p, event);
		for (t=0; t < stone->output_count; t++) {
		    if (stone->output_stone_ids[t] != -1) {
			internal_path_submit(cm, 
					     stone->output_stone_ids[t],
					     event);
			more_pending++;
		    }
		}
		return_event(evp, event);
		break;
	    }
	    case Action_Immediate: {
		EVImmediateHandlerFunc func;
		void *client_data;
		int *out_stones;
		int out_count;
		int in_play = as->events_in_play;
		/* data is already in the right format */
		func = act->o.imm.handler;
		client_data = act->o.imm.client_data;
		out_stones = stone->output_stone_ids;
		out_count = stone->output_count;
		did_something = 1;
		stone->is_processing = 1;
		func(cm, event, client_data, event->attrs, out_count, out_stones);
		stone = stone_struct(cm->evp, s);
		stone->is_processing = 0;
		return_event(evp, event);
		if (as->events_in_play > in_play)
		    more_pending++;   /* maybe??? */
		break;
	    }
            case Action_Store: {
		proto_action *p = &stone->proto_actions[act->proto_action_id];
                storage_queue_enqueue(cm, &p->o.store.queue, event);
                CMtrace_out(cm, EVerbose, "Enqueued item to store\n");
                if (++p->o.store.num_stored > p->o.store.max_stored
                        && p->o.store.max_stored != -1) {
                    CMtrace_out(cm, EVerbose, "Dequeuing item because of limit\n");
                    event_item *last_event;
                    last_event = storage_queue_dequeue(cm, &p->o.store.queue);
                    assert(last_event->ref_count > 0);
                    --p->o.store.num_stored;
                    internal_path_submit(cm, p->o.store.target_stone_id, last_event);
                    return_event(evp, last_event);
                    more_pending++;
                }
                break;
            }
	    case Action_Thread_Bridge: {
		proto_action *p = &stone->proto_actions[act->proto_action_id];
		if (p->o.thr_bri.target_cm_shutdown) continue;
                thread_bridge_transfer(cm, event, p->o.thr_bri.target_cm,
				       p->o.thr_bri.target_stone_id);
		break;
	    }
	    case Action_Bridge:
	    default:
		assert(FALSE);
	    }
	} else if (is_multi_action(act) || is_congestion_action(act)) {
	    /* event_item *event = dequeue_item(cm, stone->queue, item); XXX */
	    if (stone->new_enqueue_flag) {
		if (!item->handled) {
		    did_something = 1;
		    stone->is_processing = 1;
		    item->handled = 1;
		    if ((act->o.multi.handler)(cm, stone->queue, item,
					       act->o.multi.client_data, stone->output_count,
					       stone->output_stone_ids))
			more_pending++;
		    stone = stone_struct(cm->evp, s);
		    stone->is_processing = 0;
		}
	    }
            break;    
	} 
	item = next;
    }
    if (did_something) {
	stone->new_enqueue_flag = 0;
    }
    return more_pending;
}